

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie_tree.cpp
# Opt level: O3

void __thiscall la::trie_tree::insert(trie_tree *this,string *key)

{
  pointer pcVar1;
  size_t sVar2;
  trie_node *ptVar3;
  ulong uVar4;
  trie_node *ptVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ptVar3 = this->_root_node;
  if (key->_M_string_length != 0) {
    uVar4 = 0;
    ptVar5 = ptVar3;
    do {
      sVar2 = trie_node::convertIndex((key->_M_dataplus)._M_p + uVar4);
      ptVar3 = (ptVar5->_children)._M_elems[sVar2];
      if (ptVar3 == (trie_node *)0x0) {
        ptVar3 = (trie_node *)operator_new(0x168);
        pcVar1 = (key->_M_dataplus)._M_p;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_50,key,0,uVar4 + 1);
        trie_node::trie_node(ptVar3,pcVar1 + uVar4,&local_50);
        (ptVar5->_children)._M_elems[sVar2] = ptVar3;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        ptVar3 = (ptVar5->_children)._M_elems[sVar2];
      }
      uVar4 = uVar4 + 1;
      ptVar5 = ptVar3;
    } while (uVar4 < key->_M_string_length);
  }
  ptVar3->_is_end_word = true;
  return;
}

Assistant:

void trie_tree::insert(std::string &&key)
    {
        auto cur_node{_root_node};
        for (decltype(key.size()) i{0}; i < key.size(); ++i)
        {
            const auto ci{trie_node::convertIndex(key[i])};
            if (cur_node->_children[ci] == nullptr)
                cur_node->_children[ci] = new trie_node{key[i], key.substr(0, i + 1)};
            cur_node = cur_node->_children[ci];
        }
        cur_node->_is_end_word = true;
    }